

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_write_key_anchor(Parser *this,size_t node_id)

{
  Tree *pTVar1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  csubstr ref;
  bool bVar6;
  int iVar7;
  csubstr *pcVar8;
  size_t sVar9;
  csubstr fmt;
  csubstr fmt_00;
  csubstr anchor;
  csubstr ref_00;
  char msg [41];
  csubstr r;
  basic_substring<const_char> local_88;
  char local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  basic_substring<const_char> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  pTVar1 = this->m_tree;
  if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_88.str._0_4_ = 0;
    local_88.str._4_4_ = 0;
    local_88.len._0_4_ = 0x4b86;
    local_88.len._4_4_ = 0;
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    uStack_70 = 0x1fdf9a;
    uStack_6c = 0;
    local_68 = 0x65;
    uStack_67 = 0;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar1->m_buf[node_id].m_type.type & KEY) == NOTYPE) {
    local_68 = 0x6f;
    uStack_67 = 0x292964695f6564;
    uStack_60 = 0;
    builtin_strncpy(local_78,"_tree->h",8);
    uStack_70 = 0x6b5f7361;
    uStack_6c = 0x6e287965;
    local_88.str._0_4_ = 0x63656863;
    local_88.str._4_4_ = 0x6166206b;
    local_88.len._0_4_ = 0x64656c69;
    local_88.len._4_4_ = 0x6d28203a;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_48 = 0;
    uStack_40 = 0x76e1;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x76e1) << 0x40);
    LVar4.name.str._0_4_ = 0x1fdf9a;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_88,0x29,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pcVar2 = (this->m_key_anchor).str;
  pTVar1 = this->m_tree;
  if (pcVar2 == (char *)0x0 || (this->m_key_anchor).len == 0) {
    if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
      if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_88.str._0_4_ = 0;
      local_88.str._4_4_ = 0;
      local_88.len._0_4_ = 0x4b86;
      local_88.len._4_4_ = 0;
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      uStack_70 = 0x1fdf9a;
      uStack_6c = 0;
      local_68 = 0x65;
      uStack_67 = 0;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((~(int)pTVar1->m_buf[node_id].m_type.type & 0x2002U) != 0) {
      pcVar8 = Tree::key(this->m_tree,node_id);
      local_58.str = pcVar8->str;
      sVar9 = pcVar8->len;
      local_58.len = sVar9;
      if ((sVar9 == 0) || (*local_58.str != '*')) {
        iVar7 = basic_substring<const_char>::compare(&local_58,"<<",2);
        if (iVar7 == 0) {
          ref_00.len = sVar9;
          ref_00.str = local_58.str;
          Tree::set_key_ref(this->m_tree,node_id,ref_00);
          pTVar1 = this->m_tree;
          if ((node_id == 0xffffffffffffffff) || (pTVar1->m_cap <= node_id)) {
            if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_88.str._0_4_ = 0;
            local_88.str._4_4_ = 0;
            local_88.len._0_4_ = 0x4b86;
            local_88.len._4_4_ = 0;
            local_78[0] = '\0';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            uStack_70 = 0x1fdf9a;
            uStack_6c = 0;
            local_68 = 0x65;
            uStack_67 = 0;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((pTVar1->m_buf[node_id].m_type.type & SEQ) == NOTYPE) {
            pcVar8 = Tree::val(this->m_tree,node_id);
            if ((pcVar8->len == 0) || (*pcVar8->str != '*')) {
              bVar6 = is_debugger_attached();
              if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              pcVar8 = Tree::val(this->m_tree,node_id);
              fmt.len = 0x20;
              fmt.str = "ERROR: malformed reference: \'{}\'";
              _err<c4::basic_substring<char_const>>(this,fmt,pcVar8);
            }
          }
          else {
            for (sVar9 = Tree::first_child(this->m_tree,node_id); sVar9 != 0xffffffffffffffff;
                sVar9 = Tree::next_sibling(this->m_tree,sVar9)) {
              pcVar8 = Tree::val(this->m_tree,sVar9);
              if ((pcVar8->len == 0) || (*pcVar8->str != '*')) {
                bVar6 = is_debugger_attached();
                if ((bVar6) && (bVar6 = is_debugger_attached(), bVar6)) {
                  pcVar3 = (code *)swi(3);
                  (*pcVar3)();
                  return;
                }
                pcVar8 = Tree::val(this->m_tree,sVar9);
                fmt_00.len = 0x20;
                fmt_00.str = "ERROR: malformed reference: \'{}\'";
                _err<c4::basic_substring<char_const>>(this,fmt_00,pcVar8);
              }
            }
          }
        }
      }
      else {
        pTVar1 = this->m_tree;
        basic_substring<const_char>::basic_substring(&local_88,local_58.str + 1,sVar9 - 1);
        ref.str._4_4_ = local_88.str._4_4_;
        ref.str._0_4_ = local_88.str._0_4_;
        ref.len._0_4_ = (undefined4)local_88.len;
        ref.len._4_4_ = local_88.len._4_4_;
        Tree::set_key_ref(pTVar1,node_id,ref);
      }
    }
  }
  else {
    anchor.len = (this->m_key_anchor).len;
    anchor.str = pcVar2;
    Tree::set_key_anchor(pTVar1,node_id,anchor);
    this->m_key_anchor_was_before = false;
    this->m_key_anchor_indentation = 0;
    (this->m_key_anchor).str = (char *)0x0;
    (this->m_key_anchor).len = 0;
  }
  return;
}

Assistant:

void Parser::_write_key_anchor(size_t node_id)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->has_key(node_id));
    if( ! m_key_anchor.empty())
    {
        _c4dbgpf("node={}: set key anchor to '{}'", node_id, m_key_anchor);
        m_tree->set_key_anchor(node_id, m_key_anchor);
        m_key_anchor.clear();
        m_key_anchor_was_before = false;
        m_key_anchor_indentation = 0;
    }
    else if( ! m_tree->is_key_quoted(node_id))
    {
        csubstr r = m_tree->key(node_id);
        if(r.begins_with('*'))
        {
            _c4dbgpf("node={}: set key reference: '{}'", node_id, r);
            m_tree->set_key_ref(node_id, r.sub(1));
        }
        else if(r == "<<")
        {
            m_tree->set_key_ref(node_id, r);
            _c4dbgpf("node={}: it's an inheriting reference", node_id);
            if(m_tree->is_seq(node_id))
            {
                _c4dbgpf("node={}: inheriting from seq of {}", node_id, m_tree->num_children(node_id));
                for(size_t i = m_tree->first_child(node_id); i != NONE; i = m_tree->next_sibling(i))
                {
                    if( ! (m_tree->val(i).begins_with('*')))
                        _c4err("malformed reference: '{}'", m_tree->val(i));
                }
            }
            else if( ! m_tree->val(node_id).begins_with('*'))
            {
                 _c4err("malformed reference: '{}'", m_tree->val(node_id));
            }
            //m_tree->set_key_ref(node_id, r);
        }
    }
}